

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O1

bool __thiscall
cmGeneratorExpressionDAGChecker::EvaluatingPICExpression(cmGeneratorExpressionDAGChecker *this)

{
  int iVar1;
  cmGeneratorExpressionDAGChecker *pcVar2;
  
  do {
    pcVar2 = this;
    this = pcVar2->Parent;
  } while (this != (cmGeneratorExpressionDAGChecker *)0x0);
  iVar1 = std::__cxx11::string::compare((char *)&pcVar2->Property);
  return iVar1 == 0;
}

Assistant:

bool cmGeneratorExpressionDAGChecker::EvaluatingPICExpression()
{
  const cmGeneratorExpressionDAGChecker* top = this;
  const cmGeneratorExpressionDAGChecker* parent = this->Parent;
  while (parent) {
    top = parent;
    parent = parent->Parent;
  }

  return top->Property == "INTERFACE_POSITION_INDEPENDENT_CODE";
}